

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineTrace.cpp
# Opt level: O3

char * __thiscall llbuild::core::BuildEngineTrace::getRuleName(BuildEngineTrace *this,Rule *rule)

{
  long *plVar1;
  FILE *__stream;
  pointer pcVar2;
  char *pcVar3;
  iterator iVar4;
  long *plVar5;
  long *plVar6;
  long lVar7;
  pair<std::__detail::_Node_iterator<std::pair<const_llbuild::core::Rule_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>,_bool>
  pVar8;
  string encoded;
  char name [64];
  Rule *local_90;
  long *local_88;
  ulong local_80;
  long local_78 [2];
  char local_68 [72];
  
  __stream = (FILE *)this->outputPtr;
  local_90 = rule;
  iVar4 = std::
          _Hashtable<const_llbuild::core::Rule_*,_std::pair<const_llbuild::core::Rule_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_llbuild::core::Rule_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llbuild::core::Rule_*>,_std::hash<const_llbuild::core::Rule_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->ruleNames)._M_h,&local_90);
  if (iVar4.
      super__Node_iterator_base<std::pair<const_llbuild::core::Rule_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    return *(char **)((long)iVar4.
                            super__Node_iterator_base<std::pair<const_llbuild::core::Rule_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                            ._M_cur + 0x10);
  }
  this->numNamedRules = this->numNamedRules + 1;
  snprintf(local_68,0x40,"R%d");
  pVar8 = std::
          _Hashtable<llbuild::core::Rule_const*,std::pair<llbuild::core::Rule_const*const,std::__cxx11::string>,std::allocator<std::pair<llbuild::core::Rule_const*const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<llbuild::core::Rule_const*>,std::hash<llbuild::core::Rule_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<llbuild::core::Rule_const*&,char(&)[64]>
                    ((_Hashtable<llbuild::core::Rule_const*,std::pair<llbuild::core::Rule_const*const,std::__cxx11::string>,std::allocator<std::pair<llbuild::core::Rule_const*const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<llbuild::core::Rule_const*>,std::hash<llbuild::core::Rule_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->ruleNames,&local_90,local_68);
  pcVar2 = (local_90->key).key._M_dataplus._M_p;
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar2,pcVar2 + (local_90->key).key._M_string_length);
  plVar1 = (long *)((long)local_88 + local_80);
  plVar6 = local_88;
  if (0 < (long)local_80 >> 2) {
    plVar6 = (long *)((long)local_88 + (local_80 & 0xfffffffffffffffc));
    lVar7 = ((long)local_80 >> 2) + 1;
    plVar5 = (long *)((long)local_88 + 3);
    do {
      if (*(char *)((long)plVar5 + -3) < ' ') {
        plVar5 = (long *)((long)plVar5 + -3);
        goto LAB_00164cfb;
      }
      if (*(char *)((long)plVar5 + -2) < ' ') {
        plVar5 = (long *)((long)plVar5 + -2);
        goto LAB_00164cfb;
      }
      if (*(char *)((long)plVar5 + -1) < ' ') {
        plVar5 = (long *)((long)plVar5 + -1);
        goto LAB_00164cfb;
      }
      if ((char)*plVar5 < ' ') goto LAB_00164cfb;
      lVar7 = lVar7 + -1;
      plVar5 = (long *)((long)plVar5 + 4);
    } while (1 < lVar7);
  }
  lVar7 = (long)plVar1 - (long)plVar6;
  if (lVar7 == 1) {
LAB_00164ce0:
    plVar5 = plVar6;
    if ('\x1f' < (char)*plVar6) {
      plVar5 = plVar1;
    }
  }
  else if (lVar7 == 2) {
LAB_00164cd8:
    plVar5 = plVar6;
    if ('\x1f' < (char)*plVar6) {
      plVar6 = (long *)((long)plVar6 + 1);
      goto LAB_00164ce0;
    }
  }
  else {
    plVar5 = plVar1;
    if (lVar7 != 3) goto LAB_00164d30;
    plVar5 = plVar6;
    if ('\x1f' < (char)*plVar6) {
      plVar6 = (long *)((long)plVar6 + 1);
      goto LAB_00164cd8;
    }
  }
LAB_00164cfb:
  plVar6 = (long *)((long)plVar5 + 1);
  if (plVar6 != plVar1 && plVar5 != plVar1) {
    do {
      if ('\x1f' < (char)*plVar6) {
        *(char *)plVar5 = (char)*plVar6;
        plVar5 = (long *)((long)plVar5 + 1);
      }
      plVar6 = (long *)((long)plVar6 + 1);
    } while (plVar6 != plVar1);
  }
LAB_00164d30:
  local_80 = (long)plVar5 - (long)local_88;
  *(char *)plVar5 = '\0';
  fprintf(__stream,"{ \"new-rule\", \"%s\", \"%s\" },\n",local_68,local_88);
  pcVar3 = *(char **)((long)pVar8.first.
                            super__Node_iterator_base<std::pair<const_llbuild::core::Rule_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                            ._M_cur.
                            super__Node_iterator_base<std::pair<const_llbuild::core::Rule_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                     + 0x10);
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  return pcVar3;
}

Assistant:

const char* BuildEngineTrace::getRuleName(const Rule* rule) {
  FILE *fp = static_cast<FILE*>(outputPtr);

  // See if we have already assigned a name.
  auto it = ruleNames.find(rule);
  if (it != ruleNames.end())
    return it->second.c_str();

  // Otherwise, create a name.
  char name[64];
  snprintf(name, sizeof(name), "R%d", ++numNamedRules);
  auto result = ruleNames.emplace(rule, name);

  // Report the newly seen rule.
  // FIXME: This is currently encoding the key by merely stripping the
  // non-printable characters. Should probably encode this into a real encoding.
  std::string encoded = rule->key.str();
  encoded.erase(
                std::remove_if(encoded.begin(), encoded.end(),
                               [](char c) -> bool {
                                 return c < 32 || c > 127; }),
                encoded.end());
  fprintf(fp, "{ \"new-rule\", \"%s\", \"%s\" },\n", name, encoded.c_str());

  return result.first->second.c_str();
}